

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O0

void __thiscall
TEST_DoublingFactorCounterTest_Not_ThreeClosedTriplets_WinByDiscard_Test::
~TEST_DoublingFactorCounterTest_Not_ThreeClosedTriplets_WinByDiscard_Test
          (TEST_DoublingFactorCounterTest_Not_ThreeClosedTriplets_WinByDiscard_Test *this)

{
  TEST_DoublingFactorCounterTest_Not_ThreeClosedTriplets_WinByDiscard_Test *mem;
  TEST_DoublingFactorCounterTest_Not_ThreeClosedTriplets_WinByDiscard_Test *this_local;
  
  mem = this;
  ~TEST_DoublingFactorCounterTest_Not_ThreeClosedTriplets_WinByDiscard_Test(this);
  operator_delete(mem,(size_t)this);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, Not_ThreeClosedTriplets_WinByDiscard)
{
	addPair(Tile::WestWind);
	addSequence(Tile::SevenOfCharacters, false);
	addTriplet(Tile::OneOfCharacters, false);
	addTriplet(Tile::TwoOfCircles, false);
	addTriplet(Tile::ThreeOfBamboos, false);
		
	s.winByDiscard();
	auto r = c.report();

	CHECK_EQUAL(0, r.patterns.count(Pattern::ThreeClosedTriplets));
}